

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O3

bool __thiscall
duckdb::CatalogSet::AlterOwnership
          (CatalogSet *this,CatalogTransaction transaction,ChangeOwnershipInfo *info)

{
  CatalogType type;
  DuckCatalog *pDVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  CatalogTransaction transaction_00;
  size_type sVar4;
  CatalogSet *pCVar5;
  int iVar6;
  optional_ptr<duckdb::CatalogEntry,_true> oVar7;
  undefined4 extraout_var;
  optional_ptr<duckdb::CatalogEntry,_true> oVar8;
  undefined4 extraout_var_00;
  CatalogException *this_00;
  DatabaseInstance *pDVar9;
  bool bVar10;
  initializer_list<duckdb::CatalogType> __l;
  optional_ptr<duckdb::CatalogEntry,_true> owner_entry;
  vector<duckdb::CatalogType,_true> entry_types;
  optional_ptr<duckdb::SchemaCatalogEntry,_true> schema;
  optional_ptr<duckdb::CatalogEntry,_true> entry;
  unique_lock<std::mutex> write_lock;
  EntryLookupInfo schema_lookup;
  allocator_type local_121;
  optional_ptr<duckdb::CatalogEntry,_true> local_120;
  string local_118;
  transaction_t local_f8;
  optional_ptr<duckdb::SchemaCatalogEntry,_true> local_f0;
  optional_ptr<duckdb::CatalogEntry,_true> local_e8;
  CatalogEntry *local_e0;
  CatalogSet *local_d8;
  ChangeOwnershipInfo *local_d0;
  unique_lock<std::mutex> local_c8;
  DatabaseInstance *local_b8;
  ClientContext *pCStack_b0;
  Transaction *local_a8;
  transaction_t tStack_a0;
  transaction_t local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  EntryLookupInfo local_50;
  
  local_c8._M_device = &this->catalog->write_lock;
  local_c8._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_c8);
  local_c8._M_owns = true;
  oVar7 = GetEntryInternal(this,transaction,&(info->super_AlterInfo).name);
  local_e8 = oVar7;
  if (oVar7.ptr == (CatalogEntry *)0x0) {
LAB_0025f195:
    ::std::unique_lock<std::mutex>::~unique_lock(&local_c8);
    return oVar7.ptr != (CatalogEntry *)0x0;
  }
  local_120.ptr = (CatalogEntry *)0x0;
  pDVar1 = this->catalog;
  local_f8 = transaction.start_time;
  local_118.field_2._M_allocated_capacity = (size_type)transaction.transaction.ptr;
  local_118.field_2._8_8_ = transaction.transaction_id;
  local_118._M_dataplus._M_p = (pointer)transaction.db.ptr;
  local_118._M_string_length = (size_type)transaction.context.ptr;
  EntryLookupInfo::EntryLookupInfo
            (&local_50,SCHEMA_ENTRY,&info->owner_schema,(QueryErrorContext)0xffffffffffffffff);
  iVar6 = (*(pDVar1->super_Catalog)._vptr_Catalog[8])(pDVar1,&local_50,1);
  local_f0.ptr = (SchemaCatalogEntry *)CONCAT44(extraout_var,iVar6);
  if (local_f0.ptr != (SchemaCatalogEntry *)0x0) {
    local_50.catalog_type = TABLE_ENTRY;
    local_50._1_1_ = 6;
    __l._M_len = 2;
    __l._M_array = &local_50.catalog_type;
    ::std::vector<duckdb::CatalogType,_std::allocator<duckdb::CatalogType>_>::vector
              ((vector<duckdb::CatalogType,_std::allocator<duckdb::CatalogType>_> *)&local_118,__l,
               &local_121);
    sVar4 = local_118._M_string_length;
    local_d8 = this;
    local_d0 = info;
    if (local_118._M_dataplus._M_p == (pointer)local_118._M_string_length) {
      bVar10 = true;
    }
    else {
      _Var3._M_p = local_118._M_dataplus._M_p;
      local_e0 = oVar7.ptr;
      do {
        pDVar9 = (DatabaseInstance *)
                 ((long)&(((DatabaseInstance *)_Var3._M_p)->
                         super_enable_shared_from_this<duckdb::DatabaseInstance>).__weak_this_.
                         internal.
                         super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr + 1);
        type = *(CatalogType *)
                &(((DatabaseInstance *)_Var3._M_p)->
                 super_enable_shared_from_this<duckdb::DatabaseInstance>).__weak_this_.internal.
                 super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        optional_ptr<duckdb::SchemaCatalogEntry,_true>::CheckValid(&local_f0);
        oVar8 = SchemaCatalogEntry::GetEntry(local_f0.ptr,transaction,type,&info->owner_name);
        if (oVar8.ptr != (CatalogEntry *)0x0) break;
        local_120.ptr = (CatalogEntry *)0x0;
        _Var3._M_p = (pointer)pDVar9;
      } while (pDVar9 != (DatabaseInstance *)sVar4);
      bVar10 = oVar8.ptr == (CatalogEntry *)0x0;
      oVar7.ptr = local_e0;
      local_120 = oVar8;
    }
    if ((DatabaseInstance *)local_118._M_dataplus._M_p != (DatabaseInstance *)0x0) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    pCVar5 = local_d8;
    info = local_d0;
    if (!bVar10) {
      ::std::unique_lock<std::mutex>::unlock(&local_c8);
      iVar6 = (*(pCVar5->catalog->super_Catalog)._vptr_Catalog[0x1a])();
      local_118._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_00,iVar6);
      optional_ptr<duckdb::DependencyManager,_true>::CheckValid
                ((optional_ptr<duckdb::DependencyManager,_true> *)&local_118);
      _Var3._M_p = local_118._M_dataplus._M_p;
      local_b8 = transaction.db.ptr;
      pCStack_b0 = transaction.context.ptr;
      local_a8 = transaction.transaction.ptr;
      tStack_a0 = transaction.transaction_id;
      local_98 = transaction.start_time;
      optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_120);
      oVar8.ptr = local_120.ptr;
      optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_e8);
      transaction_00.context.ptr._0_4_ = (int)pCStack_b0;
      transaction_00.db.ptr = local_b8;
      transaction_00.context.ptr._4_4_ = (int)((ulong)pCStack_b0 >> 0x20);
      transaction_00.transaction.ptr._0_4_ = (int)local_a8;
      transaction_00.transaction.ptr._4_4_ = (int)((ulong)local_a8 >> 0x20);
      transaction_00.transaction_id._0_4_ = (int)tStack_a0;
      transaction_00.transaction_id._4_4_ = (int)(tStack_a0 >> 0x20);
      transaction_00.start_time = local_98;
      DependencyManager::AddOwnership
                ((DependencyManager *)_Var3._M_p,transaction_00,oVar8.ptr,local_e8.ptr);
      goto LAB_0025f195;
    }
  }
  this_00 = (CatalogException *)__cxa_allocate_exception(0x10);
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_118,"CatalogElement \"%s.%s\" does not exist!","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar2 = (info->owner_schema)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + (info->owner_schema)._M_string_length);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  pcVar2 = (info->owner_name)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar2,pcVar2 + (info->owner_name)._M_string_length);
  CatalogException::CatalogException<std::__cxx11::string,std::__cxx11::string>
            (this_00,&local_118,&local_70,&local_90);
  __cxa_throw(this_00,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool CatalogSet::AlterOwnership(CatalogTransaction transaction, ChangeOwnershipInfo &info) {
	// lock the catalog for writing
	unique_lock<mutex> write_lock(catalog.GetWriteLock());

	auto entry = GetEntryInternal(transaction, info.name);
	if (!entry) {
		return false;
	}
	optional_ptr<CatalogEntry> owner_entry;
	auto schema = catalog.GetSchema(transaction, info.owner_schema, OnEntryNotFound::RETURN_NULL);
	if (schema) {
		vector<CatalogType> entry_types {CatalogType::TABLE_ENTRY, CatalogType::SEQUENCE_ENTRY};
		for (auto entry_type : entry_types) {
			owner_entry = schema->GetEntry(transaction, entry_type, info.owner_name);
			if (owner_entry) {
				break;
			}
		}
	}
	if (!owner_entry) {
		throw CatalogException("CatalogElement \"%s.%s\" does not exist!", info.owner_schema, info.owner_name);
	}
	write_lock.unlock();
	catalog.GetDependencyManager()->AddOwnership(transaction, *owner_entry, *entry);
	return true;
}